

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_char_ready_p(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  sexp __stream;
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sexp psVar5;
  bool bVar6;
  
  if ((((ulong)in & 3) != 0) || (in->tag != 0x10)) {
    psVar5 = sexp_type_exception(ctx,self,0x10,in);
    return psVar5;
  }
  if ((in->value).flonum_bits[0x28] == '\0') {
    return (sexp)&DAT_0000003e;
  }
  if ((in->value).type.setters != (sexp)0x0) {
    if ((in->value).type.print < (sexp)(in->value).port.size) {
      return (sexp)&DAT_0000013e;
    }
    psVar5 = (in->value).type.slots;
    if (((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x12)) &&
       ((in->value).type.getters == (sexp)0x0)) {
      return (sexp)&DAT_0000013e;
    }
  }
  psVar5 = (in->value).type.slots;
  if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x12)) {
    __stream = (in->value).type.getters;
    if (__stream == (sexp)0x0) {
      iVar2 = (psVar5->value).promise.donep;
    }
    else {
      iVar2 = fileno((FILE *)__stream);
    }
    iVar2 = sexp_fileno_ready_p(iVar2);
    bVar6 = iVar2 != 0;
  }
  else {
    psVar5 = (in->value).type.getters;
    if (psVar5 == (sexp)0x0) {
      return (sexp)&DAT_0000013e;
    }
    iVar2 = fileno((FILE *)psVar5);
    uVar3 = fcntl(iVar2,3);
    if ((uVar3 >> 0xb & 1) == 0) {
      iVar2 = fileno((FILE *)psVar5);
      fcntl(iVar2,4,0);
    }
    iVar2 = getc((FILE *)psVar5);
    if ((uVar3 >> 0xb & 1) == 0) {
      iVar4 = fileno((FILE *)psVar5);
      fcntl(iVar4,4,(ulong)uVar3);
    }
    if ((iVar2 == -1) || (iVar4 = ferror((FILE *)psVar5), iVar4 != 0)) {
      clearerr((FILE *)psVar5);
      bVar1 = 1;
    }
    else {
      ungetc(iVar2,(FILE *)psVar5);
      bVar1 = 0;
    }
    bVar6 = (bool)(bVar1 ^ 1);
  }
  return (sexp)((ulong)bVar6 << 8 | 0x3e);
}

Assistant:

sexp sexp_char_ready_p (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  if (!sexp_port_openp(in))
    return SEXP_FALSE;
  if (sexp_port_buf(in))
    if (sexp_port_offset(in) < sexp_port_size(in)
        || (!sexp_filenop(sexp_port_fd(in)) && !sexp_port_stream(in)))
      return SEXP_TRUE;
#if SEXP_USE_GREEN_THREADS     /* maybe not just when threads are enabled */
  if (sexp_filenop(sexp_port_fd(in)))
    return sexp_make_boolean(sexp_fileno_ready_p(sexp_port_fileno(in)));
  else if (sexp_port_stream(in))
    return sexp_make_boolean(sexp_stream_ready_p(sexp_port_stream(in)));
#endif
  /* for custom ports and unthreaded compiles we just return true for now */
  return SEXP_TRUE;
}